

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void GCTM(lua_State *L)

{
  lu_byte lVar1;
  lu_byte lVar2;
  global_State *g_00;
  StkId pTVar3;
  int iVar4;
  TValue *io2_1;
  TValue *io1_1;
  TValue *io2;
  TValue *io1;
  int oldgcstp;
  lu_byte oldah;
  int status;
  GCObject *i_g;
  TValue *io;
  TValue v;
  TValue *tm;
  global_State *g;
  lua_State *L_local;
  
  g_00 = L->l_G;
  if (g_00->gcemergency != '\0') {
    __assert_fail("!g->gcemergency",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x3eb,"void GCTM(lua_State *)");
  }
  io = (TValue *)udata2finalize(g_00);
  v.value_.b._0_2_ = ((GCObject *)io)->tt | 0x8000;
  v._8_8_ = luaT_gettmbyobj(L,(TValue *)&io,TM_GC);
  if (((TValue *)v._8_8_ != (TValue *)0x0) && ((((TValue *)v._8_8_)->tt_ & 0xf) == 6)) {
    lVar1 = L->allowhook;
    lVar2 = g_00->gcstp;
    g_00->gcstp = g_00->gcstp | 2;
    L->allowhook = '\0';
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    pTVar3->value_ = ((TValue *)v._8_8_)->value_;
    pTVar3->tt_ = ((TValue *)v._8_8_)->tt_;
    if ((pTVar3->tt_ & 0x8000) != 0) {
      if ((pTVar3->tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x3f4,"void GCTM(lua_State *)");
      }
      if ((pTVar3->tt_ & 0x7f) != (ushort)((pTVar3->value_).gc)->tt) {
LAB_00145794:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x3f4,"void GCTM(lua_State *)");
      }
      if (L != (lua_State *)0x0) {
        if ((pTVar3->tt_ & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x3f4,"void GCTM(lua_State *)");
        }
        if ((((pTVar3->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_00145794;
      }
    }
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    (pTVar3->value_).gc = (GCObject *)io;
    pTVar3->tt_ = v.value_.b._0_2_;
    if ((pTVar3->tt_ & 0x8000) != 0) {
      if ((pTVar3->tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x3f5,"void GCTM(lua_State *)");
      }
      if ((pTVar3->tt_ & 0x7f) != (ushort)((pTVar3->value_).gc)->tt) {
LAB_001458b6:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x3f5,"void GCTM(lua_State *)");
      }
      if (L != (lua_State *)0x0) {
        if ((pTVar3->tt_ & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x3f5,"void GCTM(lua_State *)");
        }
        if ((((pTVar3->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_001458b6;
      }
    }
    L->ci->callstatus = L->ci->callstatus | 0x100;
    iVar4 = luaD_pcall(L,dothecall,(void *)0x0,(long)L->top + (-0x20 - (long)L->stack),0);
    L->ci->callstatus = L->ci->callstatus & 0xfeff;
    L->allowhook = lVar1;
    g_00->gcstp = lVar2;
    if (iVar4 != 0) {
      L->top = L->top + -1;
    }
  }
  return;
}

Assistant:

static void GCTM (lua_State *L) {
  global_State *g = G(L);
  const TValue *tm;
  TValue v;
  lua_assert(!g->gcemergency);
  setgcovalue(L, &v, udata2finalize(g));
  tm = luaT_gettmbyobj(L, &v, TM_GC);
  if (tm != NULL && ttisfunction(tm)) {  /* is there a finalizer? */
    int status;
    lu_byte oldah = L->allowhook;
    int oldgcstp  = g->gcstp;
    g->gcstp |= GCSTPGC;  /* avoid GC steps */
    L->allowhook = 0;  /* stop debug hooks during GC metamethod */
    setobj2s(L, L->top++, tm);  /* push finalizer... */
    setobj2s(L, L->top++, &v);  /* ... and its argument */
    L->ci->callstatus |= CIST_FIN;  /* will run a finalizer */
    status = luaD_pcall(L, dothecall, NULL, savestack(L, L->top - 2), 0);
    L->ci->callstatus &= ~CIST_FIN;  /* not running a finalizer anymore */
    L->allowhook = oldah;  /* restore hooks */
    g->gcstp = oldgcstp;  /* restore state */
    if (unlikely(status != LUA_OK)) {  /* error while running __gc? */
      //luaE_warnerror(L, "__gc");
      L->top--;  /* pops error object */
    }
  }
}